

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTiming.c
# Opt level: O0

int SimpleTimingDoRender(void)

{
  void *__ptr;
  IceTImage image_00;
  IceTUByte *color_buffer;
  double *sendbuf;
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  float fVar5;
  IceTDouble IVar6;
  IceTDouble IVar7;
  long local_300;
  IceTInt64 total_bytes_sent;
  int p;
  timings_type *timing;
  IceTInt magic_k;
  IceTInt max_image_split;
  char *si_strategy_name;
  char *strategy_name;
  timings_type *timing_collection;
  char filename [256];
  IceTUByte *buffer;
  IceTImage image;
  IceTDouble modelview_matrix [16];
  IceTDouble elapsed_time;
  int i;
  IceTInt color_bits;
  int display_rank;
  int y;
  int x;
  timings_type *timing_array;
  IceTFloat background_color [4];
  IceTDouble projection_matrix [16];
  region_divide region_divisions;
  float local_58;
  float bounds_max [3];
  float bounds_min [3];
  int frame;
  float aspect;
  IceTInt num_proc;
  IceTInt rank;
  
  fVar5 = (float)(g_num_tiles_x * SCREEN_WIDTH) / (float)(g_num_tiles_y * SCREEN_HEIGHT);
  init_opacity_lookup();
  icetGetIntegerv(2,(IceTInt *)&aspect);
  icetGetIntegerv(3,&frame);
  if (g_colored_background == '\0') {
    timing_array._0_4_ = 0;
    timing_array._4_4_ = 0;
    background_color[0] = 0.0;
    background_color[1] = 0.0;
  }
  else {
    timing_array._0_4_ = 0x3e4ccccd;
    timing_array._4_4_ = 0x3f000000;
    background_color[0] = 0.7;
    background_color[1] = 1.0;
  }
  icetDrawCallback(draw);
  if (g_transparent == '\0') {
    icetCompositeMode(0x301);
    icetSetColorFormat(0xc001);
    icetSetDepthFormat(0xd001);
  }
  else {
    icetCompositeMode(0x302);
    icetSetColorFormat(0xc002);
    icetSetDepthFormat(0xd000);
    icetEnable(0x143);
  }
  if (g_no_interlace == '\0') {
    icetEnable(0x145);
  }
  else {
    icetDisable(0x145);
  }
  if (g_no_collect == '\0') {
    icetEnable(0x146);
  }
  else {
    icetDisable(0x146);
  }
  icetBoundingBoxd(-0.5,0.5,-0.5,0.5,-0.5,0.5);
  find_region((int)aspect,frame,bounds_max + 1,(float *)((long)&region_divisions + 4),
              (region_divide *)(projection_matrix + 0xf));
  if (frame < g_num_tiles_x * g_num_tiles_y) {
    printf("Not enough processes to %dx%d tiles.\n",(ulong)(uint)g_num_tiles_x,
           (ulong)(uint)g_num_tiles_y);
    num_proc = -3;
  }
  else {
    icetResetTiles();
    i = 0;
    for (color_bits = 0; color_bits < g_num_tiles_y; color_bits = color_bits + 1) {
      for (display_rank = 0; display_rank < g_num_tiles_x; display_rank = display_rank + 1) {
        icetAddTile(display_rank * SCREEN_WIDTH,color_bits * SCREEN_HEIGHT,SCREEN_WIDTH,
                    SCREEN_HEIGHT,i);
        i = i + 1;
      }
    }
    icetStrategy(g_strategy);
    icetSingleImageStrategy(g_single_image_strategy);
    icetMatrixFrustum((IceTDouble)((double)fVar5 * -0.65),(IceTDouble)((double)fVar5 * 0.65),-0.65,
                      0.65,3.0,5.0,(IceTDouble *)(background_color + 2));
    if ((int)aspect % 10 < 7) {
      iVar1 = (int)aspect % 10 + 1;
      g_color[0] = (float)(iVar1 % 2);
      g_color[1] = (float)(int)((long)((ulong)(uint)((int)((long)iVar1 / 2) >> 0x1f) << 0x20 |
                                      (long)iVar1 / 2 & 0xffffffffU) % 2);
      g_color[2] = (float)(int)((long)((ulong)(uint)((int)((long)iVar1 / 4) >> 0x1f) << 0x20 |
                                      (long)iVar1 / 4 & 0xffffffffU) % 2);
    }
    else {
      g_color[2] = 0.5;
      g_color[1] = 0.5;
      g_color[0] = 0.5;
      g_color[(int)aspect % 10 + -7] = 0.0;
    }
    g_color[3] = 1.0;
    if (aspect == 0.0) {
      printf("Seed = %d\n",(ulong)(uint)g_seed);
      for (elapsed_time._4_4_ = 1; elapsed_time._4_4_ < frame;
          elapsed_time._4_4_ = elapsed_time._4_4_ + 1) {
        icetCommSend(&g_seed,1,0x8003,elapsed_time._4_4_,0x21);
      }
    }
    else {
      icetCommRecv(&g_seed,1,0x8003,0,0x21);
    }
    srand(g_seed);
    __ptr = malloc((long)g_num_frames * 0x50);
    for (bounds_min[1] = 0.0; (int)bounds_min[1] < g_num_frames;
        bounds_min[1] = (float)((int)bounds_min[1] + 1)) {
      icetCommBarrier();
      IVar6 = icetWallTime();
      icetMatrixIdentity((IceTDouble *)&image);
      icetMatrixMultiplyTranslate((IceTDouble *)&image,0.0,0.0,-4.0);
      iVar1 = rand();
      icetMatrixMultiplyRotate
                ((IceTDouble *)&image,(IceTDouble)(((double)iVar1 * 360.0) / 2147483647.0),1.0,0.0,
                 0.0);
      iVar1 = rand();
      icetMatrixMultiplyRotate
                ((IceTDouble *)&image,(IceTDouble)(((double)iVar1 * 360.0) / 2147483647.0),0.0,1.0,
                 0.0);
      iVar1 = rand();
      icetMatrixMultiplyRotate
                ((IceTDouble *)&image,(IceTDouble)(((double)iVar1 * 360.0) / 2147483647.0),0.0,0.0,
                 1.0);
      if (g_transparent != '\0') {
        find_composite_order
                  ((IceTDouble *)(background_color + 2),(IceTDouble *)&image,
                   (region_divide)projection_matrix[0xf]);
      }
      icetMatrixMultiplyTranslate
                ((IceTDouble *)&image,(IceTDouble)(double)bounds_max[1],
                 (IceTDouble)(double)bounds_max[2],(IceTDouble)(double)bounds_min[0]);
      icetMatrixMultiplyScale
                ((IceTDouble *)&image,(IceTDouble)(double)(region_divisions._4_4_ - bounds_max[1]),
                 (IceTDouble)(double)(local_58 - bounds_max[2]),
                 (IceTDouble)(double)(bounds_max[0] - bounds_min[0]));
      icetMatrixMultiplyTranslate((IceTDouble *)&image,0.5,0.5,0.5);
      g_first_render = '\x01';
      image_00 = icetDrawFrame((IceTDouble *)(background_color + 2),(IceTDouble *)&image,
                               (IceTFloat *)&timing_array);
      icetCommBarrier();
      IVar7 = icetWallTime();
      icetGetDoublev(0xc1,(IceTDouble *)((long)__ptr + (long)(int)bounds_min[1] * 0x50));
      icetGetDoublev(0xc2,(IceTDouble *)((long)__ptr + (long)(int)bounds_min[1] * 0x50 + 8));
      icetGetDoublev(0xc3,(IceTDouble *)((long)__ptr + (long)(int)bounds_min[1] * 0x50 + 0x10));
      icetGetDoublev(0xc4,(IceTDouble *)((long)__ptr + (long)(int)bounds_min[1] * 0x50 + 0x18));
      icetGetDoublev(0xc5,(IceTDouble *)((long)__ptr + (long)(int)bounds_min[1] * 0x50 + 0x20));
      icetGetDoublev(200,(IceTDouble *)((long)__ptr + (long)(int)bounds_min[1] * 0x50 + 0x28));
      icetGetDoublev(0xc6,(IceTDouble *)((long)__ptr + (long)(int)bounds_min[1] * 0x50 + 0x30));
      icetGetDoublev(199,(IceTDouble *)((long)__ptr + (long)(int)bounds_min[1] * 0x50 + 0x38));
      icetGetIntegerv(0xc9,(IceTInt *)((long)__ptr + (long)(int)bounds_min[1] * 0x50 + 0x40));
      *(double *)((long)__ptr + (long)(int)bounds_min[1] * 0x50 + 0x48) =
           (double)IVar7 - (double)IVar6;
      if (((g_write_image != '\0') && ((int)aspect < g_num_tiles_x * g_num_tiles_y)) &&
         (bounds_min[1] == 0.0)) {
        color_buffer = (IceTUByte *)malloc((long)(SCREEN_WIDTH * SCREEN_HEIGHT * 4));
        icetImageCopyColorub(image_00,color_buffer,0xc001);
        sprintf((char *)&timing_collection,"SimpleTiming%02d.ppm",(ulong)(uint)aspect);
        write_ppm((char *)&timing_collection,color_buffer,SCREEN_WIDTH,SCREEN_HEIGHT);
        free(color_buffer);
      }
    }
    strategy_name = (char *)malloc((long)frame * 0x50);
    si_strategy_name = icetGetStrategyName();
    if (g_single_image_strategy == 0x7004) {
      icetGetIntegerv(0x40,(IceTInt *)&timing);
      sprintf(SimpleTimingDoRender::name_buffer,"radix-k %d",(ulong)(uint)timing);
      _magic_k = SimpleTimingDoRender::name_buffer;
    }
    else {
      _magic_k = icetGetSingleImageStrategyName();
    }
    icetGetIntegerv(0x41,(IceTInt *)((long)&timing + 4));
    for (bounds_min[1] = 0.0; (int)bounds_min[1] < g_num_frames;
        bounds_min[1] = (float)((int)bounds_min[1] + 1)) {
      sendbuf = (double *)((long)__ptr + (long)(int)bounds_min[1] * 0x50);
      icetCommGather(sendbuf,0x50,0x8001,strategy_name,0);
      if (aspect == 0.0) {
        local_300 = 0;
        for (total_bytes_sent._4_4_ = 0; total_bytes_sent._4_4_ < frame;
            total_bytes_sent._4_4_ = total_bytes_sent._4_4_ + 1) {
          if (*sendbuf < *(double *)(strategy_name + (long)total_bytes_sent._4_4_ * 0x50)) {
            *sendbuf = *(double *)(strategy_name + (long)total_bytes_sent._4_4_ * 0x50);
          }
          if (sendbuf[1] < *(double *)(strategy_name + (long)total_bytes_sent._4_4_ * 0x50 + 8)) {
            sendbuf[1] = *(double *)(strategy_name + (long)total_bytes_sent._4_4_ * 0x50 + 8);
          }
          if (sendbuf[2] < *(double *)(strategy_name + (long)total_bytes_sent._4_4_ * 0x50 + 0x10))
          {
            sendbuf[2] = *(double *)(strategy_name + (long)total_bytes_sent._4_4_ * 0x50 + 0x10);
          }
          if (sendbuf[3] < *(double *)(strategy_name + (long)total_bytes_sent._4_4_ * 0x50 + 0x18))
          {
            sendbuf[3] = *(double *)(strategy_name + (long)total_bytes_sent._4_4_ * 0x50 + 0x18);
          }
          if (sendbuf[4] < *(double *)(strategy_name + (long)total_bytes_sent._4_4_ * 0x50 + 0x20))
          {
            sendbuf[4] = *(double *)(strategy_name + (long)total_bytes_sent._4_4_ * 0x50 + 0x20);
          }
          if (sendbuf[5] < *(double *)(strategy_name + (long)total_bytes_sent._4_4_ * 0x50 + 0x28))
          {
            sendbuf[5] = *(double *)(strategy_name + (long)total_bytes_sent._4_4_ * 0x50 + 0x28);
          }
          if (sendbuf[6] < *(double *)(strategy_name + (long)total_bytes_sent._4_4_ * 0x50 + 0x30))
          {
            sendbuf[6] = *(double *)(strategy_name + (long)total_bytes_sent._4_4_ * 0x50 + 0x30);
          }
          if (sendbuf[7] < *(double *)(strategy_name + (long)total_bytes_sent._4_4_ * 0x50 + 0x38))
          {
            sendbuf[7] = *(double *)(strategy_name + (long)total_bytes_sent._4_4_ * 0x50 + 0x38);
          }
          if (*(int *)(sendbuf + 8) <
              *(int *)(strategy_name + (long)total_bytes_sent._4_4_ * 0x50 + 0x40)) {
            *(undefined4 *)(sendbuf + 8) =
                 *(undefined4 *)(strategy_name + (long)total_bytes_sent._4_4_ * 0x50 + 0x40);
          }
          if (sendbuf[9] < *(double *)(strategy_name + (long)total_bytes_sent._4_4_ * 0x50 + 0x48))
          {
            sendbuf[9] = *(double *)(strategy_name + (long)total_bytes_sent._4_4_ * 0x50 + 0x48);
          }
          local_300 = *(int *)(strategy_name + (long)total_bytes_sent._4_4_ * 0x50 + 0x40) +
                      local_300;
        }
        pcVar4 = "no";
        if (g_transparent != '\0') {
          pcVar4 = "yes";
        }
        pcVar3 = "yes";
        if (g_no_interlace != '\0') {
          pcVar3 = "no";
        }
        pcVar2 = "yes";
        if (g_no_collect != '\0') {
          pcVar2 = "no";
        }
        printf("LOG,%d,%s,%s,%d,%d,%d,%d,%s,%s,%s,%d,%d,%lg,%lg,%lg,%lg,%lg,%lg,%lg,%lg,%ld,%lg\n",
               *sendbuf,sendbuf[1],sendbuf[2],sendbuf[3],sendbuf[4],sendbuf[5],sendbuf[6],sendbuf[7]
               ,(ulong)(uint)frame,si_strategy_name,_magic_k,(ulong)(uint)g_num_tiles_x,
               (ulong)(uint)g_num_tiles_y,SCREEN_WIDTH,SCREEN_HEIGHT,pcVar4,pcVar3,pcVar2,
               timing._4_4_,bounds_min[1],local_300,sendbuf[9]);
      }
    }
    free(strategy_name);
    free_region_divide((region_divide)projection_matrix[0xf]);
    free(__ptr);
    icetCommBarrier();
    num_proc = 0;
  }
  return num_proc;
}

Assistant:

static int SimpleTimingDoRender()
{
    IceTInt rank;
    IceTInt num_proc;

    float aspect = (  (float)(g_num_tiles_x*SCREEN_WIDTH)
                    / (float)(g_num_tiles_y*SCREEN_HEIGHT) );
    int frame;
    float bounds_min[3];
    float bounds_max[3];
    region_divide region_divisions;

    IceTDouble projection_matrix[16];
    IceTFloat background_color[4];

    timings_type *timing_array;

    /* Normally, the first thing that you do is set up your communication and
     * then create at least one IceT context.  This has already been done in the
     * calling function (i.e. icetTests_mpi.c).  See the init_mpi_comm in
     * mpi_comm.h for an example.
     */

    init_opacity_lookup();

    /* If we had set up the communication layer ourselves, we could have gotten
     * these parameters directly from it.  Since we did not, this provides an
     * alternate way. */
    icetGetIntegerv(ICET_RANK, &rank);
    icetGetIntegerv(ICET_NUM_PROCESSES, &num_proc);

    if (g_colored_background) {
        background_color[0] = 0.2f;
        background_color[1] = 0.5f;
        background_color[2] = 0.7f;
        background_color[3] = 1.0f;
    } else {
        background_color[0] = 0.0f;
        background_color[1] = 0.0f;
        background_color[2] = 0.0f;
        background_color[3] = 0.0f;
    }

    /* Give IceT a function that will issue the drawing commands. */
    icetDrawCallback(draw);

    /* Other IceT state. */
    if (g_transparent) {
        icetCompositeMode(ICET_COMPOSITE_MODE_BLEND);
        icetSetColorFormat(ICET_IMAGE_COLOR_RGBA_FLOAT);
        icetSetDepthFormat(ICET_IMAGE_DEPTH_NONE);
        icetEnable(ICET_CORRECT_COLORED_BACKGROUND);
    } else {
        icetCompositeMode(ICET_COMPOSITE_MODE_Z_BUFFER);
        icetSetColorFormat(ICET_IMAGE_COLOR_RGBA_UBYTE);
        icetSetDepthFormat(ICET_IMAGE_DEPTH_FLOAT);
    }

    if (g_no_interlace) {
        icetDisable(ICET_INTERLACE_IMAGES);
    } else {
        icetEnable(ICET_INTERLACE_IMAGES);
    }

    if (g_no_collect) {
        icetDisable(ICET_COLLECT_IMAGES);
    } else {
        icetEnable(ICET_COLLECT_IMAGES);
    }

    /* Give IceT the bounds of the polygons that will be drawn.  Note that IceT
     * will take care of any transformation that gets passed to
     * icetDrawFrame. */
    icetBoundingBoxd(-0.5f, 0.5f, -0.5, 0.5, -0.5, 0.5);

    /* Determine the region we want the local geometry to be in.  This will be
     * used for the modelview transformation later. */
    find_region(rank, num_proc, bounds_min, bounds_max, &region_divisions);

    /* Set up the tiled display.  The asignment of displays to processes is
     * arbitrary because, as this is a timing test, I am not too concerned
     * about who shows what. */
    if (g_num_tiles_x*g_num_tiles_y <= num_proc) {
        int x, y, display_rank;
        icetResetTiles();
        display_rank = 0;
        for (y = 0; y < g_num_tiles_y; y++) {
            for (x = 0; x < g_num_tiles_x; x++) {
                icetAddTile(x*(IceTInt)SCREEN_WIDTH,
                            y*(IceTInt)SCREEN_HEIGHT,
                            SCREEN_WIDTH,
                            SCREEN_HEIGHT,
                            display_rank);
                display_rank++;
            }
        }
    } else {
        printf("Not enough processes to %dx%d tiles.\n",
               g_num_tiles_x, g_num_tiles_y);
        return TEST_FAILED;
    }

    icetStrategy(g_strategy);
    icetSingleImageStrategy(g_single_image_strategy);

    /* Set up the projection matrix. */
    icetMatrixFrustum(-0.65*aspect, 0.65*aspect, -0.65, 0.65, 3.0, 5.0,
                      projection_matrix);

    if (rank%10 < 7) {
        IceTInt color_bits = rank%10 + 1;
        g_color[0] = (float)(color_bits%2);
        g_color[1] = (float)((color_bits/2)%2);
        g_color[2] = (float)((color_bits/4)%2);
        g_color[3] = 1.0f;
    } else {
        g_color[0] = g_color[1] = g_color[2] = 0.5f;
        g_color[rank%10 - 7] = 0.0f;
        g_color[3] = 1.0f;
    }

    /* Initialize randomness. */
    if (rank == 0) {
        int i;
        printf("Seed = %d\n", g_seed);
        for (i = 1; i < num_proc; i++) {
            icetCommSend(&g_seed, 1, ICET_INT, i, 33);
        }
    } else {
        icetCommRecv(&g_seed, 1, ICET_INT, 0, 33);
    }

    srand(g_seed);

    timing_array = malloc(g_num_frames * sizeof(timings_type));

    for (frame = 0; frame < g_num_frames; frame++) {
        IceTDouble elapsed_time;
        IceTDouble modelview_matrix[16];
        IceTImage image;

        /* Get everyone to start at the same time. */
        icetCommBarrier();

        elapsed_time = icetWallTime();

        /* We can set up a modelview matrix here and IceT will factor this in
         * determining the screen projection of the geometry. */
        icetMatrixIdentity(modelview_matrix);

        /* Move geometry back so that it can be seen by the camera. */
        icetMatrixMultiplyTranslate(modelview_matrix, 0.0, 0.0, -4.0);

        /* Rotate to some random view. */
        icetMatrixMultiplyRotate(modelview_matrix,
                                 (360.0*rand())/RAND_MAX, 1.0, 0.0, 0.0);
        icetMatrixMultiplyRotate(modelview_matrix,
                                 (360.0*rand())/RAND_MAX, 0.0, 1.0, 0.0);
        icetMatrixMultiplyRotate(modelview_matrix,
                                 (360.0*rand())/RAND_MAX, 0.0, 0.0, 1.0);

        /* Determine view ordering of geometry based on camera position
           (represented by the current projection and modelview matrices). */
        if (g_transparent) {
            find_composite_order(projection_matrix,
                                 modelview_matrix,
                                 region_divisions);
        }

        /* Translate the unit box centered on the origin to the region specified
         * by bounds_min and bounds_max. */
        icetMatrixMultiplyTranslate(modelview_matrix,
                                    bounds_min[0],
                                    bounds_min[1],
                                    bounds_min[2]);
        icetMatrixMultiplyScale(modelview_matrix,
                                bounds_max[0] - bounds_min[0],
                                bounds_max[1] - bounds_min[1],
                                bounds_max[2] - bounds_min[2]);
        icetMatrixMultiplyTranslate(modelview_matrix, 0.5, 0.5, 0.5);

      /* Instead of calling draw() directly, call it indirectly through
       * icetDrawFrame().  IceT will automatically handle image
       * compositing. */
        g_first_render = ICET_TRUE;
        image = icetDrawFrame(projection_matrix,
                              modelview_matrix,
                              background_color);

        /* Let everyone catch up before finishing the frame. */
        icetCommBarrier();

        elapsed_time = icetWallTime() - elapsed_time;

        /* Print timings to logging. */
        icetGetDoublev(ICET_RENDER_TIME,
                       &timing_array[frame].render_time);
        icetGetDoublev(ICET_BUFFER_READ_TIME,
                       &timing_array[frame].buffer_read_time);
        icetGetDoublev(ICET_BUFFER_WRITE_TIME,
                       &timing_array[frame].buffer_write_time);
        icetGetDoublev(ICET_COMPRESS_TIME,
                       &timing_array[frame].compress_time);
        icetGetDoublev(ICET_BLEND_TIME,
                       &timing_array[frame].blend_time);
        icetGetDoublev(ICET_TOTAL_DRAW_TIME,
                       &timing_array[frame].draw_time);
        icetGetDoublev(ICET_COMPOSITE_TIME,
                       &timing_array[frame].composite_time);
        icetGetDoublev(ICET_COLLECT_TIME,
                       &timing_array[frame].collect_time);
        icetGetIntegerv(ICET_BYTES_SENT,
                        &timing_array[frame].bytes_sent);
        timing_array[frame].frame_time = elapsed_time;

        /* Write out image to verify rendering occurred correctly. */
        if (   g_write_image
            && (rank < (g_num_tiles_x*g_num_tiles_y))
            && (frame == 0)
               ) {
            IceTUByte *buffer = malloc(SCREEN_WIDTH*SCREEN_HEIGHT*4);
            char filename[256];
            icetImageCopyColorub(image, buffer, ICET_IMAGE_COLOR_RGBA_UBYTE);
            sprintf(filename, "SimpleTiming%02d.ppm", rank);
            write_ppm(filename, buffer, (int)SCREEN_WIDTH, (int)SCREEN_HEIGHT);
            free(buffer);
        }
    }

    /* Print logging header. */
    {
        timings_type *timing_collection = malloc(num_proc*sizeof(timings_type));
        const char *strategy_name;
        const char *si_strategy_name;
        IceTInt max_image_split;

        strategy_name = icetGetStrategyName();
        if (g_single_image_strategy == ICET_SINGLE_IMAGE_STRATEGY_RADIXK) {
            static char name_buffer[256];
            IceTInt magic_k;

            icetGetIntegerv(ICET_MAGIC_K, &magic_k);
            sprintf(name_buffer, "radix-k %d", (int)magic_k);
            si_strategy_name = name_buffer;
        } else {
            si_strategy_name = icetGetSingleImageStrategyName();
        }

        icetGetIntegerv(ICET_MAX_IMAGE_SPLIT, &max_image_split);

        for (frame = 0; frame < g_num_frames; frame++) {
            timings_type *timing = &timing_array[frame];

            icetCommGather(timing,
                           sizeof(timings_type),
                           ICET_BYTE,
                           timing_collection,
                           0);

            if (rank == 0) {
                int p;
                IceTInt64 total_bytes_sent = 0;

                for (p = 0; p < num_proc; p++) {
#define UPDATE_MAX(field) if (timing->field < timing_collection[p].field) timing->field = timing_collection[p].field;
                    UPDATE_MAX(render_time);
                    UPDATE_MAX(buffer_read_time);
                    UPDATE_MAX(buffer_write_time);
                    UPDATE_MAX(compress_time);
                    UPDATE_MAX(blend_time);
                    UPDATE_MAX(draw_time);
                    UPDATE_MAX(composite_time);
                    UPDATE_MAX(collect_time);
                    UPDATE_MAX(bytes_sent);
                    UPDATE_MAX(frame_time);
                    total_bytes_sent += timing_collection[p].bytes_sent;
                }

                printf("LOG,%d,%s,%s,%d,%d,%d,%d,%s,%s,%s,%d,%d,%lg,%lg,%lg,%lg,%lg,%lg,%lg,%lg,%ld,%lg\n",
                       num_proc,
                       strategy_name,
                       si_strategy_name,
                       g_num_tiles_x,
                       g_num_tiles_y,
                       SCREEN_WIDTH,
                       SCREEN_HEIGHT,
                       g_transparent ? "yes" : "no",
                       g_no_interlace ? "no" : "yes",
                       g_no_collect ? "no" : "yes",
                       max_image_split,
                       frame,
                       timing->render_time,
                       timing->buffer_read_time,
                       timing->buffer_write_time,
                       timing->compress_time,
                       timing->blend_time,
                       timing->draw_time,
                       timing->composite_time,
                       timing->collect_time,
                       (long int)total_bytes_sent,
                       timing->frame_time);
            }
        }

        free(timing_collection);
    }

    free_region_divide(region_divisions);
    free(timing_array);

    /* This is to prevent a non-root from printing while the root is writing
       the log. */
    icetCommBarrier();

    return TEST_PASSED;
}